

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::PopulateIncludeDirectoriesInterface
          (cmExportFileGenerator *this,cmTargetExport *tei,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmTarget *this_00;
  char *target_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  bool bVar2;
  char *pcVar3;
  auto_ptr_ref<cmCompiledGeneratorExpression> r;
  cmCompiledGeneratorExpression *pcVar4;
  cmMakefile *pcVar5;
  ostream *poVar6;
  string *psVar7;
  ulong uVar8;
  mapped_type *pmVar9;
  char *local_488;
  allocator local_3b9;
  key_type local_3b8;
  allocator local_391;
  string local_390;
  undefined1 local_370 [8];
  string prepro;
  char *sep;
  undefined1 local_320 [8];
  string includes;
  key_type local_2f8;
  undefined4 local_2d4;
  string local_2d0;
  undefined1 local_2b0 [8];
  ostringstream e;
  cmMakefile *mf;
  string local_128;
  allocator local_101;
  string local_100;
  undefined1 local_e0 [8];
  string exportDirs;
  auto_ptr<cmCompiledGeneratorExpression> local_b0;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string dirs;
  cmGeneratorExpression ge;
  allocator local_69;
  string local_68;
  char *local_48;
  char *input;
  char *propName;
  cmTarget *target;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  ImportPropertyMap *properties_local;
  cmTargetExport *pcStack_18;
  PreprocessContext preprocessRule_local;
  cmTargetExport *tei_local;
  cmExportFileGenerator *this_local;
  
  this_00 = tei->Target;
  propName = (char *)this_00;
  target = (cmTarget *)missingTargets;
  missingTargets_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)properties;
  properties_local._4_4_ = preprocessRule;
  pcStack_18 = tei;
  tei_local = (cmTargetExport *)this;
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmExportFileGenerator.cxx"
                  ,0x1a8,
                  "void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(cmTargetExport *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, std::vector<std::string> &)"
                 );
  }
  input = "INTERFACE_INCLUDE_DIRECTORIES";
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"INTERFACE_INCLUDE_DIRECTORIES",&local_69);
  pcVar3 = cmTarget::GetProperty(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_48 = pcVar3;
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)((long)&dirs.field_2 + 8),(cmListFileBacktrace *)0x0);
  cmGeneratorExpression::Preprocess
            ((string *)&cge,&pcStack_18->InterfaceIncludeDirectories,properties_local._4_4_,true);
  (*this->_vptr_cmExportFileGenerator[5])(this,&cge);
  cmGeneratorExpression::Parse
            ((cmGeneratorExpression *)((long)&exportDirs.field_2 + 8),
             (string *)((long)&dirs.field_2 + 8));
  r = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref
                ((auto_ptr *)(exportDirs.field_2._M_local_buf + 8));
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_b0,r);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(exportDirs.field_2._M_local_buf + 8));
  pcVar4 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_b0);
  pcVar5 = cmTarget::GetMakefile((cmTarget *)propName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"",&local_101);
  pcVar3 = propName;
  std::__cxx11::string::string((string *)&local_128);
  pcVar3 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar4,pcVar5,&local_100,false,(cmTarget *)pcVar3,(cmTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_e0,pcVar3,(allocator *)((long)&mf + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&mf + 7));
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  pcVar4 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_b0);
  bVar2 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar4);
  if (bVar2) {
    pcVar5 = cmTarget::GetMakefile((cmTarget *)propName);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
    poVar6 = std::operator<<((ostream *)local_2b0,"Target \"");
    psVar7 = cmTarget::GetName_abi_cxx11_((cmTarget *)propName);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::operator<<(poVar6,
                    "\" is installed with INCLUDES DESTINATION set to a context sensitive path.  Paths which depend on the configuration, policy values or the link interface are not supported.  Consider using target_include_directories instead."
                   );
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(pcVar5,FATAL_ERROR,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    local_2d4 = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
    goto LAB_007edabb;
  }
  if ((local_48 == (char *)0x0) && (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) != 0)) {
    local_2d4 = 1;
    goto LAB_007edabb;
  }
  if (((local_48 != (char *)0x0) && (*local_48 == '\0')) &&
     (uVar8 = std::__cxx11::string::empty(), pvVar1 = missingTargets_local, pcVar3 = input,
     (uVar8 & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2f8,pcVar3,(allocator *)(includes.field_2._M_local_buf + 0xf));
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pvVar1,&local_2f8);
    std::__cxx11::string::operator=((string *)pmVar9,"");
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)(includes.field_2._M_local_buf + 0xf));
    local_2d4 = 1;
    goto LAB_007edabb;
  }
  prefixItems((string *)local_e0);
  if (local_48 == (char *)0x0) {
    local_488 = "";
  }
  else {
    local_488 = local_48;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_320,local_488,(allocator *)((long)&sep + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&sep + 7));
  pcVar3 = "";
  if (local_48 != (char *)0x0) {
    pcVar3 = ";";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&prepro.field_2 + 8),pcVar3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  std::__cxx11::string::operator+=((string *)local_320,(string *)(prepro.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(prepro.field_2._M_local_buf + 8));
  cmGeneratorExpression::Preprocess
            ((string *)local_370,(string *)local_320,properties_local._4_4_,true);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    ResolveTargetsInGeneratorExpressions
              (this,(string *)local_370,(cmTarget *)propName,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)target,NoReplaceFreeTargets);
    target_00 = propName;
    pcVar3 = input;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_390,pcVar3,&local_391);
    bVar2 = checkInterfaceDirs((string *)local_370,(cmTarget *)target_00,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    pvVar1 = missingTargets_local;
    pcVar3 = input;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3b8,pcVar3,&local_3b9);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)pvVar1,&local_3b8);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)local_370);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
      goto LAB_007eda99;
    }
    local_2d4 = 1;
  }
  else {
LAB_007eda99:
    local_2d4 = 0;
  }
  std::__cxx11::string::~string((string *)local_370);
  std::__cxx11::string::~string((string *)local_320);
LAB_007edabb:
  std::__cxx11::string::~string((string *)local_e0);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_b0);
  std::__cxx11::string::~string((string *)&cge);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)((long)&dirs.field_2 + 8));
  return;
}

Assistant:

void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(
                      cmTargetExport *tei,
                      cmGeneratorExpression::PreprocessContext preprocessRule,
                      ImportPropertyMap &properties,
                      std::vector<std::string> &missingTargets)
{
  cmTarget *target = tei->Target;
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char *propName = "INTERFACE_INCLUDE_DIRECTORIES";
  const char *input = target->GetProperty(propName);

  cmGeneratorExpression ge;

  std::string dirs = cmGeneratorExpression::Preprocess(
                                            tei->InterfaceIncludeDirectories,
                                            preprocessRule,
                                            true);
  this->ReplaceInstallPrefix(dirs);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(dirs);
  std::string exportDirs = cge->Evaluate(target->GetMakefile(), "",
                                         false, target);

  if (cge->GetHadContextSensitiveCondition())
    {
    cmMakefile* mf = target->GetMakefile();
    std::ostringstream e;
    e << "Target \"" << target->GetName() << "\" is installed with "
    "INCLUDES DESTINATION set to a context sensitive path.  Paths which "
    "depend on the configuration, policy values or the link interface are "
    "not supported.  Consider using target_include_directories instead.";
    mf->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }

  if (!input && exportDirs.empty())
    {
    return;
    }
  if ((input && !*input) && exportDirs.empty())
    {
    // Set to empty
    properties[propName] = "";
    return;
    }

  prefixItems(exportDirs);

  std::string includes = (input?input:"");
  const char* sep = input ? ";" : "";
  includes += sep + exportDirs;
  std::string prepro = cmGeneratorExpression::Preprocess(includes,
                                                         preprocessRule,
                                                         true);
  if (!prepro.empty())
    {
    this->ResolveTargetsInGeneratorExpressions(prepro, target,
                                                missingTargets);

    if (!checkInterfaceDirs(prepro, target, propName))
      {
      return;
      }
    properties[propName] = prepro;
    }
}